

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  int iVar1;
  ulong uVar2;
  int n;
  ulong uVar3;
  float fVar4;
  float fVar5;
  
  if (count == 1) {
    if (0.0 <= items->Width) {
      fVar4 = items->Width - width_excess;
      if (fVar4 <= 1.0) {
        fVar4 = 1.0;
      }
      items->Width = fVar4;
    }
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    if ((1 < count) && (0.0 < width_excess)) {
      uVar2 = 1;
      do {
        fVar4 = items->Width;
        uVar2 = (ulong)(int)uVar2;
        do {
          fVar5 = items[uVar2].Width;
          if (fVar5 < fVar4) {
            if (0.0 <= fVar5) {
              fVar4 = fVar4 - fVar5;
              goto LAB_001fc520;
            }
            break;
          }
          uVar2 = uVar2 + 1;
        } while ((long)uVar2 < (long)count);
        fVar4 = fVar4 + -1.0;
LAB_001fc520:
        if (fVar4 <= 0.0) break;
        iVar1 = (int)uVar2;
        fVar5 = width_excess / (float)iVar1;
        if (fVar4 <= fVar5) {
          fVar5 = fVar4;
        }
        if (0 < iVar1) {
          uVar3 = 0;
          do {
            items[uVar3].Width = items[uVar3].Width - fVar5;
            uVar3 = uVar3 + 1;
          } while ((uVar2 & 0xffffffff) != uVar3);
        }
        if ((count <= iVar1) ||
           (width_excess = width_excess - fVar5 * (float)iVar1, width_excess <= 0.0)) break;
      } while( true );
    }
    if (0 < count) {
      fVar4 = 0.0;
      uVar2 = 0;
      do {
        fVar5 = (float)(int)items[uVar2].Width;
        fVar4 = fVar4 + (items[uVar2].Width - fVar5);
        items[uVar2].Width = fVar5;
        uVar2 = uVar2 + 1;
      } while ((uint)count != uVar2);
      if (0.0 < fVar4 && 0 < count) {
        uVar2 = 0;
        do {
          if (items[uVar2].Index < (int)(fVar4 + 0.01)) {
            items[uVar2].Width = items[uVar2].Width + 1.0;
          }
          uVar2 = uVar2 + 1;
        } while ((uint)count != uVar2);
      }
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        if (items[0].Width >= 0.0f)
            items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count && items[count_same_width].Width >= 0.0f) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        if (max_width_to_remove_per_item <= 0.0f)
            break;
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}